

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

BOOL VIRTUALIsPageCommitted(SIZE_T nBitToRetrieve,PCMI pInformation)

{
  UINT byteMask;
  UINT nBitOffset;
  SIZE_T nByteOffset;
  PCMI pInformation_local;
  SIZE_T nBitToRetrieve_local;
  
  if (pInformation == (PCMI)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    nBitToRetrieve_local._4_4_ = 0;
  }
  else if (((uint)pInformation->pAllocState[nBitToRetrieve >> 3] & 1 << ((byte)nBitToRetrieve & 7))
           == 0) {
    nBitToRetrieve_local._4_4_ = 0;
  }
  else {
    nBitToRetrieve_local._4_4_ = 1;
  }
  return nBitToRetrieve_local._4_4_;
}

Assistant:

static BOOL VIRTUALIsPageCommitted( SIZE_T nBitToRetrieve, CONST PCMI pInformation )
{
    SIZE_T nByteOffset = 0;
    UINT nBitOffset = 0;
    UINT byteMask = 0;

    if ( !pInformation )
    {
        ERROR( "pInformation was NULL!\n" );
        return FALSE;
    }

    nByteOffset = nBitToRetrieve / CHAR_BIT;
    nBitOffset = nBitToRetrieve % CHAR_BIT;

    byteMask = 1 << nBitOffset;

    if ( pInformation->pAllocState[ nByteOffset ] & byteMask )
    {
        return TRUE;
    }
    else
    {
        return FALSE;
    }
}